

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O2

UBool __thiscall icu_63::UnifiedCache::_inProgress(UnifiedCache *this,UHashElement *element)

{
  bool bVar1;
  bool bVar2;
  UErrorCode status;
  SharedObject *value;
  UErrorCode local_2c;
  SharedObject *local_28;
  
  local_2c = U_ZERO_ERROR;
  local_28 = (SharedObject *)0x0;
  _fetch(this,element,&local_28,&local_2c);
  bVar1 = this->fNoValue == local_28;
  bVar2 = local_2c == U_ZERO_ERROR;
  removeHardRef(this,local_28);
  return bVar2 && bVar1;
}

Assistant:

UBool UnifiedCache::_inProgress(const UHashElement* element) const {
    UErrorCode status = U_ZERO_ERROR;
    const SharedObject * value = NULL;
    _fetch(element, value, status);
    UBool result = _inProgress(value, status);
    removeHardRef(value);
    return result;
}